

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManFindCut(Sbl_Man_t *p,int Obj,word CutI1,word CutI2,word CutN1,word CutN2)

{
  int iVar1;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  word *pwVar5;
  int local_6c;
  int i;
  int Limit0;
  int Start0;
  word *pCutsN2;
  word *pCutsN1;
  word *pCutsI2;
  word *pCutsI1;
  word CutN2_local;
  word CutN1_local;
  word CutI2_local;
  word CutI1_local;
  int Obj_local;
  Sbl_Man_t *p_local;
  
  pwVar2 = Vec_WrdArray(p->vCutsI1);
  pwVar3 = Vec_WrdArray(p->vCutsI2);
  pwVar4 = Vec_WrdArray(p->vCutsN1);
  pwVar5 = Vec_WrdArray(p->vCutsN2);
  local_6c = Vec_IntEntry(p->vCutsStart,Obj);
  iVar1 = Vec_IntEntry(p->vCutsNum,Obj);
  iVar1 = local_6c + iVar1;
  while( true ) {
    if (iVar1 <= local_6c) {
      return -1;
    }
    if ((((pwVar2[local_6c] == CutI1) && (pwVar3[local_6c] == CutI2)) && (pwVar4[local_6c] == CutN1)
        ) && (pwVar5[local_6c] == CutN2)) break;
    local_6c = local_6c + 1;
  }
  return local_6c;
}

Assistant:

static inline int Sbl_ManFindCut( Sbl_Man_t * p, int Obj, word CutI1, word CutI2, word CutN1, word CutN2 )
{
    word * pCutsI1 = Vec_WrdArray(p->vCutsI1);
    word * pCutsI2 = Vec_WrdArray(p->vCutsI2);
    word * pCutsN1 = Vec_WrdArray(p->vCutsN1);
    word * pCutsN2 = Vec_WrdArray(p->vCutsN2);
    int Start0 = Vec_IntEntry( p->vCutsStart, Obj );
    int Limit0 = Start0 + Vec_IntEntry( p->vCutsNum, Obj );
    int i;
    //printf( "\nLooking for:\n" );
    //Sbl_ManPrintCut( CutI, CutN );
    //printf( "\n" );
    for ( i = Start0; i < Limit0; i++ )
    {
        //Sbl_ManPrintCut( pCutsI[i], pCutsN[i] );
        if ( pCutsI1[i] == CutI1 && pCutsI2[i] == CutI2 && pCutsN1[i] == CutN1 && pCutsN2[i] == CutN2 )
            return i;
    }
    return -1;
}